

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O2

void dlep_radio_remove_interface(dlep_radio_if *interface)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar2 = (interface->interf).session_tree.list_head.next;
  while (plVar2->prev != (interface->interf).session_tree.list_head.prev) {
    plVar1 = plVar2->next;
    dlep_radio_remove_session((dlep_radio_session *)&plVar2[-0x5c].prev);
    plVar2 = plVar1;
  }
  oonf_stream_remove_managed(&interface->tcp,true);
  dlep_if_remove(&interface->interf);
  oonf_stream_free_managed_config(&interface->tcp_config);
  free((interface->interf).session.cfg.peer_type);
  abuf_free(&(interface->interf).udp_out);
  oonf_class_free(&_interface_class,interface);
  return;
}

Assistant:

void
dlep_radio_remove_interface(struct dlep_radio_if *interface) {
  /* close all sessions */
  _cleanup_interface(interface);

  /* cleanup tcp socket */
  oonf_stream_remove_managed(&interface->tcp, true);

  /* cleanup generic interface */
  dlep_if_remove(&interface->interf);

  /* free memory */
  oonf_stream_free_managed_config(&interface->tcp_config);
  free(interface->interf.session.cfg.peer_type);
  abuf_free(&interface->interf.udp_out);
  oonf_class_free(&_interface_class, interface);
}